

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void pixels::compareExact(float af,float bf,int x,int y,char *taga,char *tagb,char *chan)

{
  ostream *poVar1;
  size_t sVar2;
  uint uVar3;
  char *func;
  
  if (af == bf) {
    return;
  }
  if (chan == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1985a0);
  }
  else {
    sVar2 = strlen(chan);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,chan,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," float at ",10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," not equal: ",0xc);
  if (taga == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(taga);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,taga,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," 0x",3);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<double>((double)af);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") vs ",5);
  if (tagb == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(tagb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,tagb,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  uVar3 = *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  func = (char *)(ulong)uVar3;
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) = uVar3;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<double>((double)bf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  core_test_fail("a.iv == b.iv",(char *)0x207,0x17a7c3,func);
}

Assistant:

static inline void compareExact (
        float       af,
        float       bf,
        int         x,
        int         y,
        const char* taga,
        const char* tagb,
        const char* chan)
    {
        union
        {
            uint32_t iv;
            float    fv;
        } a, b;
        a.fv = af;
        b.fv = bf;
        if (a.iv != b.iv)
        {
            std::cout << chan << " float at " << x << ", " << y
                      << " not equal: " << taga << " 0x" << std::hex << a.iv
                      << std::dec << " (" << af << ") vs " << tagb << " "
                      << std::hex << b.iv << std::dec << " (" << bf << ")"
                      << std::endl;
        }
        EXRCORE_TEST (a.iv == b.iv);
    }